

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImageLoader::skip_data(CVmImageLoader *this,size_t skip_len,ulong *remaining_size)

{
  ulong *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  
  if (*in_RDX < in_RSI) {
    err_throw(0);
  }
  *in_RDX = *in_RDX - in_RSI;
  (**(code **)(*(long *)*in_RDI + 0x48))((long *)*in_RDI,in_RSI);
  return;
}

Assistant:

void CVmImageLoader::skip_data(size_t skip_len, ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (skip_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we're skipping */
    *remaining_size -= skip_len;

    /* skip ahead in the underlying file */
    fp_->skip_ahead(skip_len);
}